

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

void __thiscall
andres::View<int,true,std::allocator<unsigned_long>>::
coordinatesToIndex<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
          (View<int,true,std::allocator<unsigned_long>> *this,
          __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          it,size_t *out)

{
  ulong uVar1;
  unsigned_long uVar2;
  size_t sVar3;
  reference puVar4;
  ulong local_28;
  size_t j;
  size_t *out_local;
  View<int,_true,_std::allocator<unsigned_long>_> *this_local;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  it_local;
  
  this_local = (View<int,_true,_std::allocator<unsigned_long>_> *)it._M_current;
  View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)this);
  *out = 0;
  local_28 = 0;
  while( true ) {
    sVar3 = View<int,_true,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)this);
    if (sVar3 <= local_28) break;
    puVar4 = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)&this_local);
    uVar1 = *puVar4;
    sVar3 = View<int,_true,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)this,local_28);
    marray_detail::Assert<bool>(uVar1 < sVar3);
    puVar4 = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)&this_local);
    uVar2 = *puVar4;
    sVar3 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shapeStrides
                      ((Geometry<std::allocator<unsigned_long>_> *)(this + 8),local_28);
    *out = uVar2 * sVar3 + *out;
    local_28 = local_28 + 1;
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  *)&this_local);
  }
  return;
}

Assistant:

inline void 
View<T, isConst, A>::coordinatesToIndex
(
    CoordinateIterator it,
    std::size_t& out
) const
{
    testInvariant();
    out = 0;
    for(std::size_t j=0; j<this->dimension(); ++j, ++it) {
        marray_detail::Assert(MARRAY_NO_ARG_TEST || static_cast<std::size_t>(*it) < shape(j));
        out += static_cast<std::size_t>(*it) * geometry_.shapeStrides(j);
    }
}